

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxColRatio(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *lp)

{
  Real eps;
  bool bVar1;
  type_conflict5 tVar2;
  double *pdVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  multiprecision *pmVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  long lVar13;
  Item *pIVar14;
  long lVar15;
  byte bVar16;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  cpp_dec_float<200U,_int,_void> local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  multiprecision local_b0 [112];
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar16 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  for (lVar15 = 0;
      lVar15 < (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar15 = lVar15 + 1) {
    pIVar14 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar15].idx;
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_230,*pdVar3,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_1b0,0.0,(type *)0x0);
    lVar7 = 0x78;
    for (lVar13 = 0;
        lVar13 < (pIVar14->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused; lVar13 = lVar13 + 1) {
      puVar4 = (undefined8 *)
               ((long)&(((pIVar14->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem)->val).m_backend.data + lVar7);
      lVar6 = 0x1c;
      puVar8 = puVar4 + -0xf;
      pmVar10 = local_b0;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined4 *)pmVar10 = *(undefined4 *)puVar8;
        puVar8 = (undefined8 *)((long)puVar8 + (ulong)bVar16 * -8 + 4);
        pmVar10 = pmVar10 + (ulong)bVar16 * -8 + 4;
      }
      local_40 = *(undefined4 *)(puVar4 + -1);
      local_3c = *(undefined1 *)((long)puVar4 + -4);
      local_38 = *puVar4;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((type *)&p.m_backend,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      pcVar9 = &p.m_backend;
      pnVar12 = &local_130;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = p.m_backend.exp;
      local_130.m_backend.neg = p.m_backend.neg;
      local_130.m_backend.fpclass = p.m_backend.fpclass;
      local_130.m_backend.prec_elem = p.m_backend.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2c8,
                 &(this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      eps = Tolerances::epsilon(local_2c8._M_ptr);
      bVar1 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_130,eps);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c8._M_refcount);
      if (!bVar1) {
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&p.m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_230);
        if (tVar2) {
          pcVar9 = &p.m_backend;
          pcVar11 = &local_230;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar11->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_230.exp = p.m_backend.exp;
          local_230.neg = p.m_backend.neg;
          local_230.fpclass = p.m_backend.fpclass;
          local_230.prec_elem = p.m_backend.prec_elem;
        }
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&p.m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1b0);
        if (tVar2) {
          pcVar9 = &p.m_backend;
          pcVar11 = &local_1b0;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar11->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_1b0.exp = p.m_backend.exp;
          local_1b0.neg = p.m_backend.neg;
          local_1b0.fpclass = p.m_backend.fpclass;
          local_1b0.prec_elem = p.m_backend.prec_elem;
        }
      }
      lVar7 = lVar7 + 0x84;
    }
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&p.m_backend,*pdVar3,(type *)0x0);
    bVar1 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_230,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&p.m_backend);
    if (!bVar1) {
      p.m_backend.fpclass = cpp_dec_float_finite;
      p.m_backend.prec_elem = 0x1c;
      p.m_backend.data._M_elems[0] = 0;
      p.m_backend.data._M_elems[1] = 0;
      p.m_backend.data._M_elems[2] = 0;
      p.m_backend.data._M_elems[3] = 0;
      p.m_backend.data._M_elems[4] = 0;
      p.m_backend.data._M_elems[5] = 0;
      p.m_backend.data._M_elems[6] = 0;
      p.m_backend.data._M_elems[7] = 0;
      p.m_backend.data._M_elems[8] = 0;
      p.m_backend.data._M_elems[9] = 0;
      p.m_backend.data._M_elems[10] = 0;
      p.m_backend.data._M_elems[0xb] = 0;
      p.m_backend.data._M_elems[0xc] = 0;
      p.m_backend.data._M_elems[0xd] = 0;
      p.m_backend.data._M_elems[0xe] = 0;
      p.m_backend.data._M_elems[0xf] = 0;
      p.m_backend.data._M_elems[0x10] = 0;
      p.m_backend.data._M_elems[0x11] = 0;
      p.m_backend.data._M_elems[0x12] = 0;
      p.m_backend.data._M_elems[0x13] = 0;
      p.m_backend.data._M_elems[0x14] = 0;
      p.m_backend.data._M_elems[0x15] = 0;
      p.m_backend.data._M_elems[0x16] = 0;
      p.m_backend.data._M_elems[0x17] = 0;
      p.m_backend.data._M_elems[0x18] = 0;
      p.m_backend.data._M_elems[0x19] = 0;
      p.m_backend.data._M_elems._104_5_ = 0;
      p.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      p.m_backend.exp = 0;
      p.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&p.m_backend,&local_1b0,&local_230);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&p.m_backend,__return_storage_ptr__);
      if (tVar2) {
        pcVar9 = &p.m_backend;
        pnVar12 = __return_storage_ptr__;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        }
        (__return_storage_ptr__->m_backend).exp = p.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = p.m_backend.neg;
        (__return_storage_ptr__->m_backend).fpclass = p.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = p.m_backend.prec_elem;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxColRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nCols(); ++i)
   {
      const SVectorBase<R>& vec  = lp.colVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}